

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixtls.cpp
# Opt level: O0

TheCustomHeapType * initializeCustomHeap(void)

{
  long *in_FS_OFFSET;
  TheCustomHeapType *tlab;
  HoardHeapType *in_stack_ffffffffffffffe8;
  ANSIWrapper<Hoard::ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>_>
  *this;
  undefined8 local_8;
  
  local_8 = *(TheCustomHeapType **)*in_FS_OFFSET;
  if (local_8 == (TheCustomHeapType *)0x0) {
    this = (ANSIWrapper<Hoard::ThreadLocalAllocationBuffer<15,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getSizeClass,_&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144>::getClassSize,_1024UL,_16777216UL,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_262144U,_Hoard::HoardHeapType>_>
            *)*in_FS_OFFSET;
    getMainHoardHeap();
    HL::
    ANSIWrapper<Hoard::ThreadLocalAllocationBuffer<15,&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,262144,Hoard::SmallHeap>,262144ul>::getSizeClass,&HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,262144,Hoard::SmallHeap>,262144ul>::getClassSize,1024ul,16777216ul,Hoard::HoardSuperblock<HL::SpinLockType,262144,Hoard::SmallHeap,Hoard::HoardSuperblockHeader>,262144u,Hoard::HoardHeapType>>
    ::ANSIWrapper(this,in_stack_ffffffffffffffe8);
    local_8 = (TheCustomHeapType *)*in_FS_OFFSET;
    *(TheCustomHeapType **)*in_FS_OFFSET = local_8;
  }
  return local_8;
}

Assistant:

static TheCustomHeapType * initializeCustomHeap() {
  auto tlab = theTLAB;
  if (tlab == nullptr) {
    new (reinterpret_cast<char *>(&tlabBuffer)) TheCustomHeapType(getMainHoardHeap());
    tlab = reinterpret_cast<TheCustomHeapType *>(&tlabBuffer);
    theTLAB = tlab;
  }
  return tlab;
}